

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::alloc_node
          (xpath_parser *this,ast_type_t type,xpath_ast_node *left,xpath_ast_node *right,
          predicate_t test)

{
  undefined8 local_40;
  void *memory;
  predicate_t test_local;
  xpath_ast_node *right_local;
  xpath_ast_node *left_local;
  ast_type_t type_local;
  xpath_parser *this_local;
  
  local_40 = (xpath_ast_node *)alloc_node(this);
  if (local_40 == (xpath_ast_node *)0x0) {
    local_40 = (xpath_ast_node *)0x0;
  }
  else {
    xpath_ast_node::xpath_ast_node(local_40,type,left,right,test);
  }
  return local_40;
}

Assistant:

xpath_ast_node* alloc_node(ast_type_t type, xpath_ast_node* left, xpath_ast_node* right, predicate_t test)
		{
			void* memory = alloc_node();
			return memory ? new (memory) xpath_ast_node(type, left, right, test) : 0;
		}